

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void free_temp_pseudo(Proc *proc,Pseudo *pseudo,_Bool free_local)

{
  anon_union_64_3_727c6158_for_LuaSymbol_1 *paVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  PseudoGenerator *pPVar5;
  
  uVar2 = *(uint *)pseudo;
  while( true ) {
    if ((uVar2 >> 0x14 & 1) != 0) {
      return;
    }
    uVar4 = uVar2 & 0xf;
    if (uVar4 != 0xe) break;
    free_local = false;
    free_temp_pseudo(proc,(pseudo->field_3).index_info.key,false);
    pseudo = (pseudo->field_3).index_info.container;
    uVar2 = *(uint *)pseudo;
  }
  switch(uVar4) {
  case 1:
    pPVar5 = &proc->temp_flt_pseudos;
    break;
  case 2:
  case 3:
    pPVar5 = &proc->temp_int_pseudos;
    break;
  case 4:
  case 0xb:
    pPVar5 = &proc->temp_pseudos;
    if (uVar4 == 0xb) {
      if ((pseudo->field_3).range_in_use != 0) {
        __assert_fail("pseudo->range_in_use == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                      ,0x269,"void free_temp_pseudo(Proc *, Pseudo *, _Bool)");
      }
      goto LAB_00119f5b;
    }
    break;
  default:
    return;
  case 0xc:
    bVar3 = (byte)(uVar2 >> 4) & 0x1f;
    paVar1 = &((pseudo->field_3).symbol)->field_1;
    (paVar1->variable).value_type.type_code =
         (paVar1->variable).value_type.type_code & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
    return;
  }
  if (((free_local & 1U) == 0) && ((pseudo->field_3).symbol != (LuaSymbol *)0x0)) {
    return;
  }
LAB_00119f5b:
  uVar4 = uVar2 >> 4 & 0xffff;
  if (uVar4 < 0x100) {
    bVar3 = (byte)(uVar2 >> 4) & 0x3f;
    pPVar5->bits[uVar4 >> 6] =
         pPVar5->bits[uVar4 >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    return;
  }
  __assert_fail("reg < MAXBIT",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                ,0x86,"void pseudo_gen_free(PseudoGenerator *, unsigned int)");
}

Assistant:

static void free_temp_pseudo(Proc *proc, Pseudo *pseudo, bool free_local)
{
	if (pseudo->freed)
		return;
	PseudoGenerator *gen;
	switch (pseudo->type) {
	case PSEUDO_TEMP_FLT:
		gen = &proc->temp_flt_pseudos;
		break;
	case PSEUDO_TEMP_INT:
	case PSEUDO_TEMP_BOOL:
		gen = &proc->temp_int_pseudos;
		break;
	case PSEUDO_RANGE:
	case PSEUDO_TEMP_ANY:
		gen = &proc->temp_pseudos;
		if (pseudo->type == PSEUDO_RANGE) {
			// all PSEUDO_RANGE_SELECT should have been freed if the range is being freed
			assert(pseudo->range_in_use == 0);
		}
		break;
	case PSEUDO_INDEXED:
		free_temp_pseudo(proc, pseudo->index_info.key, false);
		free_temp_pseudo(proc, pseudo->index_info.container, false);
		return;
	case PSEUDO_RANGE_SELECT: {
		unsigned regbit = (1u << pseudo->regnum);
		// mark the register as no longer used; its only 1 bit not a proper ref count
		pseudo->range_pseudo->range_in_use &= ~regbit;
		return;
	}
	default:
		// Not a temp, so no need to do anything
		return;
	}
	if (!free_local && pseudo->type != PSEUDO_RANGE && pseudo->temp_for_local) {
		return;
	}
//	if (gen == &proc->temp_int_pseudos) {
//		fprintf(stderr, "Freeing reg %u\n", pseudo->regnum);
//	}
	free_register(proc, gen, pseudo->regnum);
}